

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void renameTableFunc(sqlite3_context *context,int NotUsed,sqlite3_value **argv)

{
  byte *pbVar1;
  byte bVar2;
  sqlite3 *db;
  sqlite3_xauth p_Var3;
  int iVar4;
  uint uVar5;
  RenameToken *pToken_1;
  char *pcVar6;
  char *zSql;
  char *zName;
  char *zNew;
  i64 iVar7;
  RenameToken *pRVar8;
  TriggerStep *pTVar9;
  RenameToken *pToken_2;
  FKey *pFVar10;
  long lVar11;
  RenameToken **ppRVar12;
  RenameToken *pToken_4;
  RenameToken *pRVar13;
  RenameToken *pRVar14;
  SrcList *pSVar15;
  int iVar16;
  RenameToken *pToken;
  RenameToken *pToken_5;
  long lVar17;
  long in_FS_OFFSET;
  Parse sParse;
  NameContext local_270;
  Walker local_238;
  RenameCtx local_208;
  Parse local_1e0;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  db = context->pOut->db;
  pcVar6 = (char *)sqlite3ValueText(*argv,'\x01');
  zSql = (char *)sqlite3ValueText(argv[3],'\x01');
  zName = (char *)sqlite3ValueText(argv[4],'\x01');
  zNew = (char *)sqlite3ValueText(argv[5],'\x01');
  iVar7 = sqlite3VdbeIntValue(argv[6]);
  if (zNew == (char *)0x0 || (zName == (char *)0x0 || zSql == (char *)0x0)) goto LAB_001b2282;
  memset(&local_1e0,0xaa,0x1a8);
  p_Var3 = db->xAuth;
  db->xAuth = (sqlite3_xauth)0x0;
  if (db->noSharedCache == '\0') {
    btreeEnterAll(db);
  }
  local_208.pTab = (Table *)0x0;
  local_208.zOld = (char *)0x0;
  local_208.pList = (RenameToken *)0x0;
  local_208.nList = 0;
  local_208.iCol = 0;
  local_208.pTab = sqlite3FindTable(db,zName,pcVar6);
  local_238.xSelectCallback2 = (_func_void_Walker_ptr_Select_ptr *)0x0;
  local_238.walkerDepth = 0;
  local_238.eCode = 0;
  local_238.mWFlags = 0;
  local_238.xExprCallback = renameTableExprCb;
  local_238.xSelectCallback = renameTableSelectCb;
  local_238.pParse = &local_1e0;
  local_238.u.pNC = (NameContext *)&local_208;
  iVar4 = renameParseSql(&local_1e0,pcVar6,db,zSql,(int)iVar7);
  if (iVar4 != 0) goto LAB_001b21d5;
  uVar5 = (uint)db->flags;
  if (local_1e0.pNewTable == (Table *)0x0) {
    if (local_1e0.pNewIndex == (Index *)0x0) {
      pcVar6 = (local_1e0.pNewTrigger)->table;
      if (pcVar6 != (char *)0x0) {
        lVar11 = 0;
        do {
          bVar2 = pcVar6[lVar11];
          if (bVar2 == zName[lVar11]) {
            if ((ulong)bVar2 == 0) goto LAB_001b1f83;
          }
          else if (""[bVar2] != ""[(byte)zName[lVar11]]) break;
          lVar11 = lVar11 + 1;
        } while( true );
      }
      goto LAB_001b2020;
    }
    pcVar6 = (local_1e0.pNewIndex)->zName;
    if (local_1e0.pRename != (RenameToken *)0x0 && pcVar6 != (char *)0x0) {
      if ((char *)(local_1e0.pRename)->p == pcVar6) {
        ppRVar12 = &local_1e0.pRename;
        pRVar8 = local_1e0.pRename;
      }
      else {
        do {
          pRVar8 = local_1e0.pRename;
          local_1e0.pRename = pRVar8->pNext;
          if (local_1e0.pRename == (RenameToken *)0x0) goto LAB_001b1f55;
        } while ((char *)(local_1e0.pRename)->p != pcVar6);
        ppRVar12 = &pRVar8->pNext;
        pRVar8 = local_1e0.pRename;
      }
      *ppRVar12 = pRVar8->pNext;
      pRVar8->pNext = local_208.pList;
      local_208.nList = local_208.nList + 1;
      local_208.pList = pRVar8;
    }
LAB_001b1f55:
    if (((uVar5 >> 0x1a & 1) == 0) && ((local_1e0.pNewIndex)->pPartIdxWhere != (Expr *)0x0)) {
      sqlite3WalkExprNN(&local_238,(local_1e0.pNewIndex)->pPartIdxWhere);
    }
  }
  else if ((local_1e0.pNewTable)->eTabType == '\x02') {
    if ((uVar5 >> 0x1a & 1) == 0) {
      local_270.ncFlags = 0;
      local_270.nNestedSelect = 0;
      local_270.pWinSelect = (Select *)0x0;
      local_270.pNext = (NameContext *)0x0;
      local_270.nRef = 0;
      local_270.nNcErr = 0;
      local_270.pSrcList = (SrcList *)0x0;
      local_270.uNC.pEList = (ExprList *)0x0;
      pbVar1 = (byte *)((long)&(((local_1e0.pNewTable)->u).view.pSelect)->selFlags + 2);
      *pbVar1 = *pbVar1 & 0xdf;
      local_270.pParse = &local_1e0;
      sqlite3SelectPrep(&local_1e0,((local_1e0.pNewTable)->u).view.pSelect,&local_270);
      if (local_1e0.nErr == 0) {
        sqlite3WalkSelect(&local_238,((local_1e0.pNewTable)->u).view.pSelect);
      }
      else {
        iVar4 = local_1e0.rc;
        if (local_1e0.rc != 0) goto LAB_001b21d5;
      }
    }
  }
  else {
    if (((((byte)(db->flags >> 0x1a) & 0x3f & (uVar5 >> 0xe & 1) == 0) == 0) &&
        ((local_1e0.pNewTable)->eTabType != '\x01')) &&
       (pFVar10 = ((local_1e0.pNewTable)->u).tab.pFKey, pFVar10 != (FKey *)0x0)) {
      pRVar8 = local_208.pList;
      iVar4 = local_208.nList;
LAB_001b1da0:
      pcVar6 = pFVar10->zTo;
      if (pcVar6 != (char *)0x0) {
        lVar11 = 0;
        do {
          bVar2 = pcVar6[lVar11];
          if (bVar2 == zName[lVar11]) {
            if ((ulong)bVar2 == 0) goto LAB_001b1dd2;
          }
          else if (""[bVar2] != ""[(byte)zName[lVar11]]) break;
          lVar11 = lVar11 + 1;
        } while( true );
      }
      goto LAB_001b1e1b;
    }
LAB_001b1e28:
    pcVar6 = (local_1e0.pNewTable)->zName;
    if (pcVar6 != (char *)0x0) {
      lVar11 = 0;
      do {
        bVar2 = zName[lVar11];
        if (bVar2 == pcVar6[lVar11]) {
          if ((ulong)bVar2 == 0) goto LAB_001b1eb1;
        }
        else if (""[bVar2] != ""[(byte)pcVar6[lVar11]]) break;
        lVar11 = lVar11 + 1;
      } while( true );
    }
  }
  goto LAB_001b21b3;
LAB_001b1f83:
  if (local_1e0.pRename != (RenameToken *)0x0 &&
      (local_208.pTab)->pSchema == (local_1e0.pNewTrigger)->pTabSchema) {
    pRVar8 = local_1e0.pRename;
    if ((char *)(local_1e0.pRename)->p == pcVar6) {
      ppRVar12 = &local_1e0.pRename;
    }
    else {
      do {
        pRVar14 = pRVar8;
        pRVar8 = pRVar14->pNext;
        if (pRVar8 == (RenameToken *)0x0) goto LAB_001b2020;
      } while ((char *)pRVar8->p != pcVar6);
      ppRVar12 = &pRVar14->pNext;
    }
    *ppRVar12 = pRVar8->pNext;
    pRVar8->pNext = local_208.pList;
    local_208.nList = local_208.nList + 1;
    local_208.pList = pRVar8;
  }
LAB_001b2020:
  if ((uVar5 >> 0x1a & 1) != 0) goto LAB_001b21b3;
  iVar4 = renameResolveTrigger(&local_1e0);
  if (iVar4 == 0) {
    renameWalkTrigger(&local_238,local_1e0.pNewTrigger);
    pTVar9 = (local_1e0.pNewTrigger)->step_list;
    if (pTVar9 != (TriggerStep *)0x0) {
      pRVar8 = local_208.pList;
      iVar4 = local_208.nList;
LAB_001b2077:
      pcVar6 = pTVar9->zTarget;
      if (pcVar6 != (char *)0x0) {
        lVar11 = 0;
        do {
          bVar2 = pcVar6[lVar11];
          if (bVar2 == zName[lVar11]) {
            if ((ulong)bVar2 == 0) goto LAB_001b20a9;
          }
          else if (""[bVar2] != ""[(byte)zName[lVar11]]) break;
          lVar11 = lVar11 + 1;
        } while( true );
      }
      goto LAB_001b20f2;
    }
    goto LAB_001b21b3;
  }
  goto LAB_001b21d5;
LAB_001b20a9:
  if (local_1e0.pRename != (RenameToken *)0x0) {
    pRVar14 = local_1e0.pRename;
    ppRVar12 = &local_1e0.pRename;
    if ((char *)(local_1e0.pRename)->p != pcVar6) {
      do {
        pRVar13 = pRVar14;
        pRVar14 = pRVar13->pNext;
        if (pRVar14 == (RenameToken *)0x0) goto LAB_001b20f2;
      } while ((char *)pRVar14->p != pcVar6);
      ppRVar12 = &pRVar13->pNext;
    }
    *ppRVar12 = pRVar14->pNext;
    pRVar14->pNext = pRVar8;
    iVar4 = iVar4 + 1;
    local_208.nList = iVar4;
    pRVar8 = pRVar14;
    local_208.pList = pRVar14;
  }
LAB_001b20f2:
  pSVar15 = pTVar9->pFrom;
  if ((pSVar15 != (SrcList *)0x0) && (iVar16 = pSVar15->nSrc, 0 < iVar16)) {
    lVar11 = 0;
LAB_001b210e:
    pcVar6 = pSVar15->a[lVar11].zName;
    if (pcVar6 != (char *)0x0) {
      lVar17 = 0;
      do {
        bVar2 = pcVar6[lVar17];
        if (bVar2 == zName[lVar17]) {
          if ((ulong)bVar2 == 0) goto LAB_001b2146;
        }
        else if (""[bVar2] != ""[(byte)zName[lVar17]]) break;
        lVar17 = lVar17 + 1;
      } while( true );
    }
    goto LAB_001b2197;
  }
LAB_001b21a6:
  pTVar9 = pTVar9->pNext;
  if (pTVar9 == (TriggerStep *)0x0) goto LAB_001b21b3;
  goto LAB_001b2077;
LAB_001b2146:
  if (local_1e0.pRename != (RenameToken *)0x0) {
    ppRVar12 = &local_1e0.pRename;
    pRVar14 = local_1e0.pRename;
    if ((char *)(local_1e0.pRename)->p != pcVar6) {
      do {
        pRVar13 = pRVar14;
        pRVar14 = pRVar13->pNext;
        if (pRVar14 == (RenameToken *)0x0) goto LAB_001b2197;
      } while ((char *)pRVar14->p != pcVar6);
      ppRVar12 = &pRVar13->pNext;
    }
    *ppRVar12 = pRVar14->pNext;
    pRVar14->pNext = pRVar8;
    iVar4 = iVar4 + 1;
    local_208.nList = iVar4;
    pSVar15 = pTVar9->pFrom;
    iVar16 = pSVar15->nSrc;
    pRVar8 = pRVar14;
    local_208.pList = pRVar14;
  }
LAB_001b2197:
  lVar11 = lVar11 + 1;
  if (iVar16 <= lVar11) goto LAB_001b21a6;
  goto LAB_001b210e;
LAB_001b1dd2:
  if (local_1e0.pRename != (RenameToken *)0x0) {
    pRVar14 = local_1e0.pRename;
    ppRVar12 = &local_1e0.pRename;
    if ((char *)(local_1e0.pRename)->p != pcVar6) {
      do {
        pRVar13 = pRVar14;
        pRVar14 = pRVar13->pNext;
        if (pRVar14 == (RenameToken *)0x0) goto LAB_001b1e1b;
      } while ((char *)pRVar14->p != pcVar6);
      ppRVar12 = &pRVar13->pNext;
    }
    *ppRVar12 = pRVar14->pNext;
    pRVar14->pNext = pRVar8;
    iVar4 = iVar4 + 1;
    local_208.nList = iVar4;
    pRVar8 = pRVar14;
    local_208.pList = pRVar14;
  }
LAB_001b1e1b:
  pFVar10 = pFVar10->pNextFrom;
  if (pFVar10 == (FKey *)0x0) goto LAB_001b1e28;
  goto LAB_001b1da0;
LAB_001b1eb1:
  local_208.pTab = local_1e0.pNewTable;
  if ((uVar5 >> 0x1a & 1) == 0) {
    sqlite3WalkExprList(&local_238,(local_1e0.pNewTable)->pCheck);
    pcVar6 = (local_1e0.pNewTable)->zName;
  }
  if (local_1e0.pRename != (RenameToken *)0x0 && pcVar6 != (char *)0x0) {
    if ((char *)(local_1e0.pRename)->p == pcVar6) {
      ppRVar12 = &local_1e0.pRename;
      pRVar8 = local_1e0.pRename;
    }
    else {
      do {
        pRVar8 = local_1e0.pRename;
        local_1e0.pRename = pRVar8->pNext;
        if (local_1e0.pRename == (RenameToken *)0x0) goto LAB_001b21b3;
      } while ((char *)(local_1e0.pRename)->p != pcVar6);
      ppRVar12 = &pRVar8->pNext;
      pRVar8 = local_1e0.pRename;
    }
    *ppRVar12 = pRVar8->pNext;
    pRVar8->pNext = local_208.pList;
    local_208.nList = local_208.nList + 1;
    local_208.pList = pRVar8;
  }
LAB_001b21b3:
  iVar4 = renameEditSql(context,&local_208,zSql,zNew,1);
LAB_001b21d5:
  if (iVar4 != 0) {
    if ((iVar4 == 1) && ((db->flags & 0x10000001) == 1)) {
      sqlite3_result_value(context,argv[3]);
    }
    else if (local_1e0.zErrMsg == (char *)0x0) {
      sqlite3_result_error_code(context,iVar4);
    }
    else {
      renameColumnParseError(context,"",argv[1],argv[2],&local_1e0);
    }
  }
  renameParseCleanup(&local_1e0);
  pRVar8 = local_208.pList;
  while (pRVar8 != (RenameToken *)0x0) {
    pRVar14 = pRVar8->pNext;
    sqlite3DbFreeNN(db,pRVar8);
    pRVar8 = pRVar14;
  }
  if (db->noSharedCache == '\0') {
    btreeLeaveAll(db);
  }
  db->xAuth = p_Var3;
LAB_001b2282:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void renameTableFunc(
  sqlite3_context *context,
  int NotUsed,
  sqlite3_value **argv
){
  sqlite3 *db = sqlite3_context_db_handle(context);
  const char *zDb = (const char*)sqlite3_value_text(argv[0]);
  const char *zInput = (const char*)sqlite3_value_text(argv[3]);
  const char *zOld = (const char*)sqlite3_value_text(argv[4]);
  const char *zNew = (const char*)sqlite3_value_text(argv[5]);
  int bTemp = sqlite3_value_int(argv[6]);
  UNUSED_PARAMETER(NotUsed);

  if( zInput && zOld && zNew ){
    Parse sParse;
    int rc;
    int bQuote = 1;
    RenameCtx sCtx;
    Walker sWalker;

#ifndef SQLITE_OMIT_AUTHORIZATION
    sqlite3_xauth xAuth = db->xAuth;
    db->xAuth = 0;
#endif

    sqlite3BtreeEnterAll(db);

    memset(&sCtx, 0, sizeof(RenameCtx));
    sCtx.pTab = sqlite3FindTable(db, zOld, zDb);
    memset(&sWalker, 0, sizeof(Walker));
    sWalker.pParse = &sParse;
    sWalker.xExprCallback = renameTableExprCb;
    sWalker.xSelectCallback = renameTableSelectCb;
    sWalker.u.pRename = &sCtx;

    rc = renameParseSql(&sParse, zDb, db, zInput, bTemp);

    if( rc==SQLITE_OK ){
      int isLegacy = (db->flags & SQLITE_LegacyAlter);
      if( sParse.pNewTable ){
        Table *pTab = sParse.pNewTable;

        if( IsView(pTab) ){
          if( isLegacy==0 ){
            Select *pSelect = pTab->u.view.pSelect;
            NameContext sNC;
            memset(&sNC, 0, sizeof(sNC));
            sNC.pParse = &sParse;

            assert( pSelect->selFlags & SF_View );
            pSelect->selFlags &= ~SF_View;
            sqlite3SelectPrep(&sParse, pTab->u.view.pSelect, &sNC);
            if( sParse.nErr ){
              rc = sParse.rc;
            }else{
              sqlite3WalkSelect(&sWalker, pTab->u.view.pSelect);
            }
          }
        }else{
          /* Modify any FK definitions to point to the new table. */
#ifndef SQLITE_OMIT_FOREIGN_KEY
          if( (isLegacy==0 || (db->flags & SQLITE_ForeignKeys))
           && !IsVirtual(pTab)
          ){
            FKey *pFKey;
            assert( IsOrdinaryTable(pTab) );
            for(pFKey=pTab->u.tab.pFKey; pFKey; pFKey=pFKey->pNextFrom){
              if( sqlite3_stricmp(pFKey->zTo, zOld)==0 ){
                renameTokenFind(&sParse, &sCtx, (void*)pFKey->zTo);
              }
            }
          }
#endif

          /* If this is the table being altered, fix any table refs in CHECK
          ** expressions. Also update the name that appears right after the
          ** "CREATE [VIRTUAL] TABLE" bit. */
          if( sqlite3_stricmp(zOld, pTab->zName)==0 ){
            sCtx.pTab = pTab;
            if( isLegacy==0 ){
              sqlite3WalkExprList(&sWalker, pTab->pCheck);
            }
            renameTokenFind(&sParse, &sCtx, pTab->zName);
          }
        }
      }

      else if( sParse.pNewIndex ){
        renameTokenFind(&sParse, &sCtx, sParse.pNewIndex->zName);
        if( isLegacy==0 ){
          sqlite3WalkExpr(&sWalker, sParse.pNewIndex->pPartIdxWhere);
        }
      }

#ifndef SQLITE_OMIT_TRIGGER
      else{
        Trigger *pTrigger = sParse.pNewTrigger;
        TriggerStep *pStep;
        if( 0==sqlite3_stricmp(sParse.pNewTrigger->table, zOld)
            && sCtx.pTab->pSchema==pTrigger->pTabSchema
          ){
          renameTokenFind(&sParse, &sCtx, sParse.pNewTrigger->table);
        }

        if( isLegacy==0 ){
          rc = renameResolveTrigger(&sParse);
          if( rc==SQLITE_OK ){
            renameWalkTrigger(&sWalker, pTrigger);
            for(pStep=pTrigger->step_list; pStep; pStep=pStep->pNext){
              if( pStep->zTarget && 0==sqlite3_stricmp(pStep->zTarget, zOld) ){
                renameTokenFind(&sParse, &sCtx, pStep->zTarget);
              }
              if( pStep->pFrom ){
                int i;
                for(i=0; i<pStep->pFrom->nSrc; i++){
                  SrcItem *pItem = &pStep->pFrom->a[i];
                  if( 0==sqlite3_stricmp(pItem->zName, zOld) ){
                    renameTokenFind(&sParse, &sCtx, pItem->zName);
                  }
                }
              }
            }
          }
        }
      }
#endif
    }

    if( rc==SQLITE_OK ){
      rc = renameEditSql(context, &sCtx, zInput, zNew, bQuote);
    }
    if( rc!=SQLITE_OK ){
      if( rc==SQLITE_ERROR && sqlite3WritableSchema(db) ){
        sqlite3_result_value(context, argv[3]);
      }else if( sParse.zErrMsg ){
        renameColumnParseError(context, "", argv[1], argv[2], &sParse);
      }else{
        sqlite3_result_error_code(context, rc);
      }
    }

    renameParseCleanup(&sParse);
    renameTokenFree(db, sCtx.pList);
    sqlite3BtreeLeaveAll(db);
#ifndef SQLITE_OMIT_AUTHORIZATION
    db->xAuth = xAuth;
#endif
  }

  return;
}